

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O3

void __thiscall llvm::Twine::printOneChildRepr(Twine *this,raw_ostream *OS,Child Ptr,NodeKind Kind)

{
  raw_ostream *prVar1;
  undefined7 in_register_00000009;
  uint *__n;
  size_t sVar2;
  void *__buf;
  unsigned_long N;
  char *pcVar3;
  long N_00;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  
  __n = &switchD_00da2d76::switchdataD_00e686f4;
  switch(CONCAT71(in_register_00000009,Kind) & 0xffffffff) {
  case 0:
    pcVar3 = "null";
    sVar2 = 4;
    goto LAB_00da2f37;
  case 1:
    pcVar3 = "empty";
    sVar2 = 5;
    goto LAB_00da2f37;
  case 2:
    Str_03.Length = 5;
    Str_03.Data = "rope:";
    raw_ostream::operator<<(OS,Str_03);
    printRepr(Ptr.twine,OS);
    return;
  case 3:
    Str_04.Length = 9;
    Str_04.Data = "cstring:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_04);
    OS = raw_ostream::operator<<(prVar1,Ptr.cString);
    break;
  case 4:
    pcVar3 = "std::string:\"";
    sVar2 = 0xd;
    goto LAB_00da2eaf;
  case 5:
    pcVar3 = "stringref:\"";
    sVar2 = 0xb;
    goto LAB_00da2eaf;
  case 6:
    Str_08.Length = 0xd;
    Str_08.Data = "smallstring:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_08);
    OS = (raw_ostream *)
         raw_ostream::write(prVar1,((Ptr.twine)->LHS).decI,(void *)(ulong)((Ptr.twine)->RHS).decUI,
                            (size_t)__n);
    break;
  case 7:
    Str_05.Length = 9;
    Str_05.Data = "formatv:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_05);
    OS = raw_ostream::operator<<(prVar1,Ptr.formatvObject);
    break;
  case 8:
    Str_11.Length = 6;
    Str_11.Data = "char:\"";
    OS = raw_ostream::operator<<(OS,Str_11);
    pcVar3 = OS->OutBufCur;
    if (pcVar3 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar3 + 1;
      *pcVar3 = Ptr.character;
    }
    else {
      OS = (raw_ostream *)raw_ostream::write(OS,Ptr.decUI & 0xff,__buf,(size_t)pcVar3);
    }
    break;
  case 9:
    Str_02.Length = 7;
    Str_02.Data = "decUI:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_02);
    N = (ulong)Ptr.twine & 0xffffffff;
    goto LAB_00da2e09;
  case 10:
    Str_09.Length = 6;
    Str_09.Data = "decI:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_09);
    N_00 = (long)(int)Ptr.decUI;
    goto LAB_00da2f20;
  case 0xb:
    Str_00.Length = 7;
    Str_00.Data = "decUL:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_00);
    N = *Ptr.decUL;
LAB_00da2e09:
    OS = raw_ostream::operator<<(prVar1,N);
    break;
  case 0xc:
    Str_01.Length = 6;
    Str_01.Data = "decL:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_01);
    N_00 = *Ptr.decL;
LAB_00da2f20:
    OS = raw_ostream::operator<<(prVar1,N_00);
    break;
  case 0xd:
    Str_07.Length = 8;
    Str_07.Data = "decULL:\"";
    prVar1 = raw_ostream::operator<<(OS,Str_07);
    OS = raw_ostream::operator<<(prVar1,*Ptr.decULL);
    break;
  case 0xe:
    Str.Length = 7;
    Str.Data = "decLL:\"";
    prVar1 = raw_ostream::operator<<(OS,Str);
    OS = raw_ostream::operator<<(prVar1,*Ptr.decLL);
    break;
  case 0xf:
    pcVar3 = "uhex:\"";
    sVar2 = 6;
LAB_00da2eaf:
    Str_06.Length = sVar2;
    Str_06.Data = pcVar3;
    prVar1 = raw_ostream::operator<<(OS,Str_06);
    OS = raw_ostream::operator<<(prVar1,Ptr.twine);
    break;
  default:
    return;
  }
  pcVar3 = "\"";
  sVar2 = 1;
LAB_00da2f37:
  Str_10.Length = sVar2;
  Str_10.Data = pcVar3;
  raw_ostream::operator<<(OS,Str_10);
  return;
}

Assistant:

void Twine::printOneChildRepr(raw_ostream &OS, Child Ptr,
                              NodeKind Kind) const {
  switch (Kind) {
  case Twine::NullKind:
    OS << "null"; break;
  case Twine::EmptyKind:
    OS << "empty"; break;
  case Twine::TwineKind:
    OS << "rope:";
    Ptr.twine->printRepr(OS);
    break;
  case Twine::CStringKind:
    OS << "cstring:\""
       << Ptr.cString << "\"";
    break;
  case Twine::StdStringKind:
    OS << "std::string:\""
       << Ptr.stdString << "\"";
    break;
  case Twine::StringRefKind:
    OS << "stringref:\""
       << Ptr.stringRef << "\"";
    break;
  case Twine::SmallStringKind:
    OS << "smallstring:\"" << *Ptr.smallString << "\"";
    break;
  case Twine::FormatvObjectKind:
    OS << "formatv:\"" << *Ptr.formatvObject << "\"";
    break;
  case Twine::CharKind:
    OS << "char:\"" << Ptr.character << "\"";
    break;
  case Twine::DecUIKind:
    OS << "decUI:\"" << Ptr.decUI << "\"";
    break;
  case Twine::DecIKind:
    OS << "decI:\"" << Ptr.decI << "\"";
    break;
  case Twine::DecULKind:
    OS << "decUL:\"" << *Ptr.decUL << "\"";
    break;
  case Twine::DecLKind:
    OS << "decL:\"" << *Ptr.decL << "\"";
    break;
  case Twine::DecULLKind:
    OS << "decULL:\"" << *Ptr.decULL << "\"";
    break;
  case Twine::DecLLKind:
    OS << "decLL:\"" << *Ptr.decLL << "\"";
    break;
  case Twine::UHexKind:
    OS << "uhex:\"" << Ptr.uHex << "\"";
    break;
  }
}